

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O0

int64_t secp256k1_modinv64_posdivsteps_62_var
                  (int64_t eta,uint64_t f0,uint64_t g0,secp256k1_modinv64_trans2x2 *t,int *jacp)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  byte bVar7;
  long *in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  uint *in_R8;
  uint64_t tmp;
  int jac;
  int zeros;
  int limit;
  int i;
  uint32_t w;
  uint64_t m;
  uint64_t g;
  uint64_t f;
  uint64_t r;
  uint64_t q;
  uint64_t v;
  uint64_t u;
  int local_88;
  int local_84;
  uint local_74;
  int local_68;
  uint local_64;
  ulong local_58;
  ulong local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  long local_8;
  
  local_30 = 1;
  local_38 = 0;
  local_40 = 0;
  local_48 = 1;
  local_68 = 0x3e;
  local_74 = *in_R8;
  local_58 = in_RDX;
  local_50 = in_RSI;
  local_8 = in_RDI;
  while( true ) {
    uVar3 = secp256k1_ctz64_var(local_58 | -1L << ((byte)local_68 & 0x3f));
    bVar7 = (byte)uVar3;
    uVar4 = local_58 >> (bVar7 & 0x3f);
    lVar5 = local_30 << (bVar7 & 0x3f);
    lVar6 = local_38 << (bVar7 & 0x3f);
    local_8 = local_8 - (int)uVar3;
    local_68 = local_68 - uVar3;
    local_74 = local_74 ^ uVar3 & ((uint)(local_50 >> 1) ^ (uint)(local_50 >> 2));
    if (local_68 == 0) break;
    iVar2 = (int)uVar4;
    iVar1 = (int)local_50;
    if (local_8 < 0) {
      local_8 = -local_8;
      local_58 = local_50;
      local_30 = local_40;
      local_38 = local_48;
      local_74 = local_74 ^ (uint)((uVar4 & local_50) >> 1);
      local_84 = local_68;
      if ((int)local_8 + 1 <= local_68) {
        local_84 = (int)local_8 + 1;
      }
      local_64 = iVar2 * iVar1 * (iVar2 * iVar2 + -2) &
                 (uint)(0xffffffffffffffff >> (0x40U - (char)local_84 & 0x3f)) & 0x3f;
      local_50 = uVar4;
      local_48 = lVar6;
      local_40 = lVar5;
    }
    else {
      local_88 = local_68;
      if ((int)local_8 + 1 <= local_68) {
        local_88 = (int)local_8 + 1;
      }
      local_64 = -(iVar1 + (iVar1 + 1U & 4) * 2) * iVar2 &
                 (uint)(0xffffffffffffffff >> (0x40U - (char)local_88 & 0x3f)) & 0xf;
      local_58 = uVar4;
      local_38 = lVar6;
      local_30 = lVar5;
    }
    local_58 = local_50 * local_64 + local_58;
    local_40 = local_30 * (ulong)local_64 + local_40;
    local_48 = local_38 * (ulong)local_64 + local_48;
  }
  *in_RCX = lVar5;
  in_RCX[1] = lVar6;
  in_RCX[2] = local_40;
  in_RCX[3] = local_48;
  *in_R8 = local_74;
  return local_8;
}

Assistant:

static int64_t secp256k1_modinv64_posdivsteps_62_var(int64_t eta, uint64_t f0, uint64_t g0, secp256k1_modinv64_trans2x2 *t, int *jacp) {
    /* Transformation matrix; see comments in secp256k1_modinv64_divsteps_62. */
    uint64_t u = 1, v = 0, q = 0, r = 1;
    uint64_t f = f0, g = g0, m;
    uint32_t w;
    int i = 62, limit, zeros;
    int jac = *jacp;

    for (;;) {
        /* Use a sentinel bit to count zeros only up to i. */
        zeros = secp256k1_ctz64_var(g | (UINT64_MAX << i));
        /* Perform zeros divsteps at once; they all just divide g by two. */
        g >>= zeros;
        u <<= zeros;
        v <<= zeros;
        eta -= zeros;
        i -= zeros;
        /* Update the bottom bit of jac: when dividing g by an odd power of 2,
         * if (f mod 8) is 3 or 5, the Jacobi symbol changes sign. */
        jac ^= (zeros & ((f >> 1) ^ (f >> 2)));
        /* We're done once we've done 62 posdivsteps. */
        if (i == 0) break;
        VERIFY_CHECK((f & 1) == 1);
        VERIFY_CHECK((g & 1) == 1);
        VERIFY_CHECK((u * f0 + v * g0) == f << (62 - i));
        VERIFY_CHECK((q * f0 + r * g0) == g << (62 - i));
        /* If eta is negative, negate it and replace f,g with g,f. */
        if (eta < 0) {
            uint64_t tmp;
            eta = -eta;
            tmp = f; f = g; g = tmp;
            tmp = u; u = q; q = tmp;
            tmp = v; v = r; r = tmp;
            /* Update bottom bit of jac: when swapping f and g, the Jacobi symbol changes sign
             * if both f and g are 3 mod 4. */
            jac ^= ((f & g) >> 1);
            /* Use a formula to cancel out up to 6 bits of g. Also, no more than i can be cancelled
             * out (as we'd be done before that point), and no more than eta+1 can be done as its
             * sign will flip again once that happens. */
            limit = ((int)eta + 1) > i ? i : ((int)eta + 1);
            VERIFY_CHECK(limit > 0 && limit <= 62);
            /* m is a mask for the bottom min(limit, 6) bits. */
            m = (UINT64_MAX >> (64 - limit)) & 63U;
            /* Find what multiple of f must be added to g to cancel its bottom min(limit, 6)
             * bits. */
            w = (f * g * (f * f - 2)) & m;
        } else {
            /* In this branch, use a simpler formula that only lets us cancel up to 4 bits of g, as
             * eta tends to be smaller here. */
            limit = ((int)eta + 1) > i ? i : ((int)eta + 1);
            VERIFY_CHECK(limit > 0 && limit <= 62);
            /* m is a mask for the bottom min(limit, 4) bits. */
            m = (UINT64_MAX >> (64 - limit)) & 15U;
            /* Find what multiple of f must be added to g to cancel its bottom min(limit, 4)
             * bits. */
            w = f + (((f + 1) & 4) << 1);
            w = (-w * g) & m;
        }
        g += f * w;
        q += u * w;
        r += v * w;
        VERIFY_CHECK((g & m) == 0);
    }
    /* Return data in t and return value. */
    t->u = (int64_t)u;
    t->v = (int64_t)v;
    t->q = (int64_t)q;
    t->r = (int64_t)r;

    /* The determinant of t must be a power of two. This guarantees that multiplication with t
     * does not change the gcd of f and g, apart from adding a power-of-2 factor to it (which
     * will be divided out again). As each divstep's individual matrix has determinant 2 or -2,
     * the aggregate of 62 of them will have determinant 2^62 or -2^62. */
    VERIFY_CHECK(secp256k1_modinv64_det_check_pow2(t, 62, 1));

    *jacp = jac;
    return eta;
}